

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_351f5::ArenaTest_FuzzAllocSpaceAllocatedRace_Test::TestBody
          (ArenaTest_FuzzAllocSpaceAllocatedRace_Test *this)

{
  pointer ptVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  allocator_type *paVar4;
  char *pcVar5;
  anon_class_16_2_f6a74b90_for__M_head_impl *__args;
  thread *t;
  ulong uVar6;
  bool bVar7;
  Time TVar8;
  upb_Arena *arena;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  Notification done;
  upb_Arena *local_60;
  vector<std::thread,_std::allocator<std::thread>_> local_58;
  undefined1 local_40 [16];
  Notification local_30;
  
  upb_Arena_SetMaxBlockSize(0x80);
  local_60 = upb_Arena_Init((void *)0x0,0,&upb_alloc_global);
  local_40._8_8_ = &local_60;
  local_40._0_8_ = &local_30;
  local_30.mutex_.mu_.super___atomic_base<long>._M_i = (atomic<long>)(__atomic_base<long>)0x0;
  local_30.notified_yet_._M_base._M_i = (__atomic_base<bool>)false;
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar4 = (allocator_type *)
           __gnu_cxx::new_allocator<std::thread>::allocate
                     ((new_allocator<std::thread> *)&local_58,1,(void *)0x0);
  std::allocator_traits<std::allocator<std::thread>>::
  construct<std::thread,(anonymous_namespace)::ArenaTest_FuzzAllocSpaceAllocatedRace_Test::TestBody()::__1>
            (paVar4,(thread *)local_40,__args);
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(paVar4 + 8);
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)paVar4;
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
       super__Vector_impl_data._M_finish;
  TVar8 = absl::lts_20250127::Now();
  local_40._0_8_ = TVar8.rep_.rep_hi_;
  local_40._8_4_ = TVar8.rep_.rep_lo_;
  uVar6 = 0;
  absl::lts_20250127::Duration::operator+=((Duration *)local_40,(Duration)ZEXT812(2));
  uVar3 = local_40._8_4_;
  uVar2 = local_40._0_8_;
  do {
    TVar8 = absl::lts_20250127::Now();
    if (TVar8.rep_.rep_hi_ == (HiRep)uVar2) {
      bVar7 = TVar8.rep_.rep_lo_ < (uint)uVar3;
    }
    else {
      bVar7 = (long)TVar8.rep_.rep_hi_ < (long)uVar2;
    }
    if ((!bVar7) || (9999999 < uVar6)) break;
    pcVar5 = local_60->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)local_60->end_dont_copy_me__upb_internal_use_only - (long)pcVar5) < 0x80) {
      pcVar5 = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(local_60,0x80);
    }
    else {
      if ((char *)((ulong)(pcVar5 + 7) & 0xfffffffffffffff8) != pcVar5) {
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                      ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      local_60->ptr_dont_copy_me__upb_internal_use_only = pcVar5 + 0x80;
    }
    uVar6 = uVar6 + 0x80;
  } while (pcVar5 != (char *)0x0);
  absl::lts_20250127::Notification::Notify(&local_30);
  ptVar1 = local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (paVar4 = (allocator_type *)
                local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start; paVar4 != (allocator_type *)ptVar1;
      paVar4 = paVar4 + 8) {
    std::thread::join();
  }
  upb_Arena_Free(local_60);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_58);
  absl::lts_20250127::Notification::~Notification(&local_30);
  upb_Arena_SetMaxBlockSize(0x8000);
  return;
}

Assistant:

TEST(ArenaTest, FuzzAllocSpaceAllocatedRace) {
  upb_Arena_SetMaxBlockSize(128);
  absl::Cleanup reset_max_block_size = [] {
    upb_Arena_SetMaxBlockSize(UPB_PRIVATE(kUpbDefaultMaxBlockSize));
  };
  upb_Arena* arena = upb_Arena_New();
  absl::Notification done;
  std::vector<std::thread> threads;
  for (int i = 0; i < 1; ++i) {
    threads.emplace_back([&]() {
      while (!done.HasBeenNotified()) {
        size_t count;
        upb_Arena_SpaceAllocated(arena, &count);
      }
    });
  }

  auto end = absl::Now() + absl::Seconds(2);
  uintptr_t total = 0;
  while (absl::Now() < end && total < 10000000) {
    if (upb_Arena_Malloc(arena, 128) == nullptr) {
      break;
    }
    total += 128;
  }
  done.Notify();
  for (auto& t : threads) t.join();
  upb_Arena_Free(arena);
}